

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfB44Compressor.cpp
# Opt level: O1

void __thiscall
Imf_2_5::B44Compressor::B44Compressor
          (B44Compressor *this,Header *hdr,size_t maxScanLineSize,size_t numScanLines,
          bool optFlatFields)

{
  _Rb_tree_color type;
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  ChannelList *pCVar4;
  unsigned_long uVar5;
  size_t sVar6;
  unsigned_short *puVar7;
  const_iterator cVar8;
  ConstIterator CVar9;
  char *pcVar10;
  ChannelData *pCVar11;
  Box2i *pBVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  
  Compressor::Compressor(&this->super_Compressor,hdr);
  (this->super_Compressor)._vptr_Compressor = (_func_int **)&PTR__B44Compressor_0315f9c8;
  this->_maxScanLineSize = (int)maxScanLineSize;
  this->_optFlatFields = optFlatFields;
  this->_format = XDR;
  this->_numScanLines = (int)numScanLines;
  this->_tmpBuffer = (unsigned_short *)0x0;
  this->_outBuffer = (char *)0x0;
  this->_numChans = 0;
  pCVar4 = Header::channels(hdr);
  this->_channels = pCVar4;
  this->_channelData = (ChannelData *)0x0;
  uVar5 = uiMult<unsigned_long>(maxScanLineSize,numScanLines);
  sVar6 = checkArraySize<unsigned_long>(uVar5,2);
  uVar13 = 0xffffffffffffffff;
  if (-1 < (long)sVar6) {
    uVar13 = sVar6 * 2;
  }
  puVar7 = (unsigned_short *)operator_new__(uVar13);
  this->_tmpBuffer = puVar7;
  pCVar4 = Header::channels((this->super_Compressor)._header);
  cVar8._M_node = (_Base_ptr)ChannelList::begin(pCVar4);
  iVar15 = 0;
  while( true ) {
    CVar9 = ChannelList::end(pCVar4);
    if ((const_iterator)cVar8._M_node == CVar9._i._M_node) break;
    this->_numChans = this->_numChans + 1;
    iVar15 = iVar15 + (uint)(cVar8._M_node[9]._M_color == _S_black);
    cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar8._M_node);
  }
  uVar5 = uiMult<unsigned_long>(maxScanLineSize,numScanLines);
  uVar5 = uiAdd<unsigned_long>(uVar5,(ulong)(uint)(iVar15 * 0xc) * (numScanLines + 3) >> 2);
  pcVar10 = (char *)operator_new__(uVar5);
  this->_outBuffer = pcVar10;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->_numChans;
  uVar13 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x28),8) == 0) {
    uVar13 = SUB168(auVar1 * ZEXT816(0x28),0);
  }
  pCVar11 = (ChannelData *)operator_new__(uVar13);
  this->_channelData = pCVar11;
  cVar8._M_node = (_Base_ptr)ChannelList::begin(pCVar4);
  lVar14 = 0;
  while( true ) {
    CVar9 = ChannelList::end(pCVar4);
    if ((const_iterator)cVar8._M_node == CVar9._i._M_node) break;
    pCVar11 = this->_channelData;
    *(undefined4 *)((long)&pCVar11->ys + lVar14) = *(undefined4 *)&cVar8._M_node[9]._M_parent;
    type = cVar8._M_node[9]._M_color;
    *(_Rb_tree_color *)((long)&pCVar11->type + lVar14) = type;
    (&pCVar11->pLinear)[lVar14] = *(bool *)((long)&cVar8._M_node[9]._M_parent + 4);
    iVar2 = pixelTypeSize(type);
    iVar3 = pixelTypeSize(HALF);
    *(int *)((long)&this->_channelData->size + lVar14) = iVar2 / iVar3;
    cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar8._M_node);
    lVar14 = lVar14 + 0x28;
  }
  pBVar12 = Header::dataWindow(hdr);
  this->_minX = (pBVar12->min).x;
  iVar2 = (pBVar12->max).y;
  this->_maxX = (pBVar12->max).x;
  this->_maxY = iVar2;
  if (this->_numChans == iVar15) {
    this->_format = NATIVE;
  }
  return;
}

Assistant:

B44Compressor::B44Compressor
    (const Header &hdr,
     size_t maxScanLineSize,
     size_t numScanLines,
     bool optFlatFields)
:
    Compressor (hdr),
    _maxScanLineSize (maxScanLineSize),
    _optFlatFields (optFlatFields),
    _format (XDR),
    _numScanLines (numScanLines),
    _tmpBuffer (0),
    _outBuffer (0),
    _numChans (0),
    _channels (hdr.channels()),
    _channelData (0)
{
    // TODO: Remove this when we can change the ABI
    (void)_maxScanLineSize;
    //
    // Allocate buffers for compressed an uncompressed pixel data,
    // allocate a set of ChannelData structs to help speed up the
    // compress() and uncompress() functions, below, and determine
    // if uncompressed pixel data should be in native or Xdr format.
    //

    _tmpBuffer = new unsigned short
        [checkArraySize (uiMult (maxScanLineSize, numScanLines),
                         sizeof (unsigned short))];

    const ChannelList &channels = header().channels();
    int numHalfChans = 0;

    for (ChannelList::ConstIterator c = channels.begin();
	 c != channels.end();
	 ++c)
    {
	assert (pixelTypeSize (c.channel().type) % pixelTypeSize (HALF) == 0);
	++_numChans;

	if (c.channel().type == HALF)
	    ++numHalfChans;
    }

    //
    // Compressed data may be larger than the input data
    //

    size_t padding = 12 * numHalfChans * (numScanLines + 3) / 4;

    _outBuffer = new char
        [uiAdd (uiMult (maxScanLineSize, numScanLines), padding)];

    _channelData = new ChannelData[_numChans];

    int i = 0;

    for (ChannelList::ConstIterator c = channels.begin();
	 c != channels.end();
	 ++c, ++i)
    {
	_channelData[i].ys = c.channel().ySampling;
	_channelData[i].type = c.channel().type;
	_channelData[i].pLinear = c.channel().pLinear;
	_channelData[i].size =
	    pixelTypeSize (c.channel().type) / pixelTypeSize (HALF);
    }

    const Box2i &dataWindow = hdr.dataWindow();

    _minX = dataWindow.min.x;
    _maxX = dataWindow.max.x;
    _maxY = dataWindow.max.y;

    //
    // We can support uncompressed data in the machine's native
    // format only if all image channels are of type HALF.
    //

    assert (sizeof (unsigned short) == pixelTypeSize (HALF));

    if (_numChans == numHalfChans)
	_format = NATIVE;
}